

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_manager.cpp
# Opt level: O3

bool __thiscall
duckdb::LogManager::RegisterLogStorage
          (LogManager *this,string *name,shared_ptr<duckdb::LogStorage,_true> *storage)

{
  pointer pcVar1;
  iterator iVar2;
  __hashtable *__h;
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  iVar2 = ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::LogStorage,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::LogStorage,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->registered_log_storages)._M_h,name);
  if (iVar2.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::LogStorage,_true>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    pcVar1 = (name->_M_dataplus)._M_p;
    local_58[0] = local_48;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)local_58,pcVar1,pcVar1 + name->_M_string_length);
    local_38 = *(undefined4 *)
                &(storage->internal).
                 super___shared_ptr<duckdb::LogStorage,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uStack_34 = *(undefined4 *)
                 ((long)&(storage->internal).
                         super___shared_ptr<duckdb::LogStorage,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                 4);
    uStack_30 = *(undefined4 *)
                 &(storage->internal).
                  super___shared_ptr<duckdb::LogStorage,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
    uStack_2c = *(undefined4 *)
                 ((long)&(storage->internal).
                         super___shared_ptr<duckdb::LogStorage,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi + 4);
    (storage->internal).super___shared_ptr<duckdb::LogStorage,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (storage->internal).super___shared_ptr<duckdb::LogStorage,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    ::std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::shared_ptr<duckdb::LogStorage,true>>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::shared_ptr<duckdb::LogStorage,true>>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::pair<std::__cxx11::string_const,duckdb::shared_ptr<duckdb::LogStorage,true>>>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::shared_ptr<duckdb::LogStorage,true>>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::shared_ptr<duckdb::LogStorage,true>>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&this->registered_log_storages,local_58);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_2c,uStack_30) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_2c,uStack_30));
    }
    if (local_58[0] != local_48) {
      operator_delete(local_58[0]);
    }
  }
  return iVar2.
         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::LogStorage,_true>_>,_true>
         ._M_cur == (__node_type *)0x0;
}

Assistant:

bool LogManager::RegisterLogStorage(const string &name, shared_ptr<LogStorage> &storage) {
	if (registered_log_storages.find(name) != registered_log_storages.end()) {
		return false;
	}
	registered_log_storages.insert({name, std::move(storage)});
	return true;
}